

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void cinatra::to_chunked_buffers
               (vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *buffers,
               string *size_str,string_view chunk_data,bool eof)

{
  basic_string_view<char,_std::char_traits<char>_> data;
  basic_string_view<char,_std::char_traits<char>_> data_00;
  basic_string_view<char,_std::char_traits<char>_> data_01;
  char *__str;
  size_type __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte in_R8B;
  to_chars_result tVar1;
  string_view chunk_size;
  char *ptr;
  size_t length;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  char *local_40;
  errc local_38;
  size_type local_30;
  byte local_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_21 = in_R8B & 1;
  local_18 = in_RDI;
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  if (local_30 != 0) {
    detail::resize<char>(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
    in_stack_fffffffffffffef0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2853b6);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2853c8);
    tVar1 = std::to_chars((char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                          (unsigned_long)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    local_40 = tVar1.ptr;
    local_38 = tVar1.ec;
    __str = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x285402
                      );
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x285414);
    __len = std::distance<char*>((char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,__str,__len);
    data._M_str = (char *)in_stack_fffffffffffffef0;
    data._M_len = (size_t)in_stack_fffffffffffffee8;
    pbVar2 = local_18;
    asio::buffer<char,std::char_traits<char>>(data);
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
               in_stack_fffffffffffffee0,
               (value_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    asio::buffer<char,std::char_traits<char>,std::allocator<char>>(in_stack_fffffffffffffee0);
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
               in_stack_fffffffffffffee0,
               (value_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    data_01._M_str = (char *)pbVar2;
    data_01._M_len = (size_t)__str;
    asio::buffer<char,std::char_traits<char>>(data_01,(size_t)in_stack_fffffffffffffef0);
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
               in_stack_fffffffffffffee0,
               (value_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    asio::buffer<char,std::char_traits<char>,std::allocator<char>>(in_stack_fffffffffffffee0);
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
               in_stack_fffffffffffffee0,
               (value_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  if ((local_21 & 1) != 0) {
    data_00._M_str = (char *)in_stack_fffffffffffffef0;
    data_00._M_len = (size_t)in_stack_fffffffffffffee8;
    asio::buffer<char,std::char_traits<char>>(data_00);
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)local_18,
               (value_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    asio::buffer<char,std::char_traits<char>,std::allocator<char>>(local_18);
    std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>::push_back
              ((vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)local_18,
               (value_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  return;
}

Assistant:

inline void to_chunked_buffers(std::vector<asio::const_buffer> &buffers,
                               std::string &size_str,
                               std::string_view chunk_data, bool eof) {
  size_t length = chunk_data.size();
  if (length > 0) {
    // convert bytes transferred count to a hex string.
    detail::resize(size_str, 20);
    auto [ptr, ec] =
        std::to_chars(size_str.data(), size_str.data() + 20, length, 16);
    std::string_view chunk_size{size_str.data(),
                                size_t(std::distance(size_str.data(), ptr))};

    // Construct chunk based on rfc2616 section 3.6.1
    buffers.push_back(asio::buffer(chunk_size));
    buffers.push_back(asio::buffer(CRCF));
    buffers.push_back(asio::buffer(chunk_data, length));
    buffers.push_back(asio::buffer(CRCF));
  }

  // append last-chunk
  if (eof) {
    buffers.push_back(asio::buffer(LAST_CHUNK));
    buffers.push_back(asio::buffer(CRCF));
  }
}